

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::MethodPrototypeSymbol::MethodPrototypeSymbol
          (MethodPrototypeSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          SubroutineKind subroutineKind,Visibility visibility,bitmask<slang::ast::MethodFlags> flags
          )

{
  string_view name_00;
  char *in_RCX;
  size_t in_RDX;
  Symbol *in_RDI;
  SourceLocation in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined2 in_stack_00000010;
  Compilation *in_stack_ffffffffffffffa8;
  bitmask<slang::ast::DeclaredTypeFlags> flags_00;
  
  name_00._M_str = in_RCX;
  name_00._M_len = in_RDX;
  Symbol::Symbol(in_RDI,MethodPrototype,name_00,in_R8);
  Scope::Scope((Scope *)in_R8,in_stack_ffffffffffffffa8,in_RDI);
  flags_00.m_bits = in_R8._4_4_;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask
            ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xffffffffffffffac,None);
  DeclaredType::DeclaredType((DeclaredType *)in_stack_ffffffffffffffa8,in_RDI,flags_00);
  *(undefined4 *)&in_RDI[2].originatingSyntax = in_R9D;
  *(undefined4 *)((long)&in_RDI[2].originatingSyntax + 4) = in_stack_00000008;
  *(undefined2 *)&in_RDI[3].kind = in_stack_00000010;
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)0x4a5b74
            );
  std::optional<const_slang::ast::SubroutineSymbol_*>::optional
            ((optional<const_slang::ast::SubroutineSymbol_*> *)0x4a5b85);
  in_RDI[3].nextInScope = (Symbol *)0x0;
  *(undefined1 *)&in_RDI[3].indexInScope = 0;
  in_RDI[3].originatingSyntax = (SyntaxNode *)0x0;
  return;
}

Assistant:

MethodPrototypeSymbol::MethodPrototypeSymbol(Compilation& compilation, std::string_view name,
                                             SourceLocation loc, SubroutineKind subroutineKind,
                                             Visibility visibility, bitmask<MethodFlags> flags) :
    Symbol(SymbolKind::MethodPrototype, name, loc), Scope(compilation, this),
    declaredReturnType(*this), subroutineKind(subroutineKind), visibility(visibility),
    flags(flags) {
}